

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O2

mecab_path_t * __thiscall
MeCab::Allocator<mecab_node_t,_mecab_path_t>::newPath(Allocator<mecab_node_t,_mecab_path_t> *this)

{
  FreeList<mecab_path_t> *this_00;
  mecab_path_t *pmVar1;
  
  this_00 = (this->path_freelist_).ptr_;
  if (this_00 == (FreeList<mecab_path_t> *)0x0) {
    this_00 = (FreeList<mecab_path_t> *)operator_new(0x38);
    this_00->_vptr_FreeList = (_func_int **)&PTR__FreeList_0019f060;
    this_00->li_ = 0;
    (this_00->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->freeList).super__Vector_base<mecab_path_t_*,_std::allocator<mecab_path_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->pi_ = 0;
    this_00->size = 0x800;
    (this->path_freelist_).ptr_ = this_00;
  }
  pmVar1 = FreeList<mecab_path_t>::alloc(this_00);
  return pmVar1;
}

Assistant:

P *newPath() {
    if (!path_freelist_.get()) {
      path_freelist_.reset(new FreeList<P>(PATH_FREELIST_SIZE));
    }
    return path_freelist_->alloc();
  }